

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_parse.c
# Opt level: O2

ngx_int_t ngx_http_parse_set_cookie_lines(ngx_array_t *headers,ngx_str_t *name,ngx_str_t *value)

{
  u_char *puVar1;
  u_char *puVar2;
  void *pvVar3;
  ngx_log_t *log;
  ulong uVar4;
  ngx_int_t nVar5;
  long lVar6;
  u_char *puVar7;
  u_char *puVar8;
  ulong uVar9;
  
  pvVar3 = headers->elts;
  uVar9 = 0;
  do {
    if (headers->nelts <= uVar9) {
      return -5;
    }
    log = headers->pool->log;
    if ((log->log_level & 0x100) != 0) {
      lVar6 = *(long *)((long)pvVar3 + uVar9 * 8);
      ngx_log_error_core(8,log,0,"parse header: \"%V: %V\"",lVar6 + 8,lVar6 + 0x18);
    }
    lVar6 = *(long *)((long)pvVar3 + uVar9 * 8);
    uVar4 = *(ulong *)(lVar6 + 0x18);
    if (name->len < uVar4) {
      puVar7 = *(u_char **)(lVar6 + 0x20);
      nVar5 = ngx_strncasecmp(puVar7,name->data,name->len);
      if (nVar5 == 0) {
        puVar1 = puVar7 + uVar4;
        lVar6 = uVar4 - name->len;
        for (puVar7 = puVar7 + name->len; (puVar7 < puVar1 && (*puVar7 == ' ')); puVar7 = puVar7 + 1
            ) {
          lVar6 = lVar6 + -1;
        }
        if ((lVar6 != 0) && (*puVar7 == '=')) break;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
  while (*puVar7 == ' ') {
    puVar8 = puVar7;
    puVar7 = puVar8 + 1;
    if (puVar1 <= puVar7) break;
  }
  for (lVar6 = 1; (puVar2 = puVar8 + lVar6, puVar2 < puVar1 && (*puVar2 != ';')); lVar6 = lVar6 + 1)
  {
  }
  value->len = lVar6 - 1;
  value->data = puVar7;
  return uVar9;
}

Assistant:

ngx_int_t
ngx_http_parse_set_cookie_lines(ngx_array_t *headers, ngx_str_t *name,
    ngx_str_t *value)
{
    ngx_uint_t         i;
    u_char            *start, *last, *end;
    ngx_table_elt_t  **h;

    h = headers->elts;

    for (i = 0; i < headers->nelts; i++) {

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, headers->pool->log, 0,
                       "parse header: \"%V: %V\"", &h[i]->key, &h[i]->value);

        if (name->len >= h[i]->value.len) {
            continue;
        }

        start = h[i]->value.data;
        end = h[i]->value.data + h[i]->value.len;

        if (ngx_strncasecmp(start, name->data, name->len) != 0) {
            continue;
        }

        for (start += name->len; start < end && *start == ' '; start++) {
            /* void */
        }

        if (start == end || *start++ != '=') {
            /* the invalid header value */
            continue;
        }

        while (start < end && *start == ' ') { start++; }

        for (last = start; last < end && *last != ';'; last++) {
            /* void */
        }

        value->len = last - start;
        value->data = start;

        return i;
    }

    return NGX_DECLINED;
}